

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::FlattenRunEndsSwitch<int>
               (Vector *result,ArrowRunEndEncodingState *run_end_encoding,idx_t compressed_size,
               idx_t scan_offset,idx_t size)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  ulong *puVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  element_type *peVar4;
  long lVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  byte bVar10;
  undefined8 uVar11;
  element_type *peVar12;
  type pVVar13;
  type pVVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  NotImplementedException *this_00;
  ulong uVar16;
  ulong uVar17;
  PhysicalType type;
  data_ptr_t pdVar18;
  ulong uVar19;
  idx_t idx_in_entry_1;
  idx_t iVar20;
  ulong uVar21;
  idx_t iVar22;
  ulong uVar23;
  idx_t idx_in_entry;
  ulong uVar24;
  UnifiedVectorFormat value_format;
  UnifiedVectorFormat run_end_format;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  buffer_ptr<ValidityBuffer> *local_f8;
  idx_t local_f0;
  idx_t local_e8;
  UnifiedVectorFormat local_e0;
  undefined1 local_98 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  this = &run_end_encoding->values;
  pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
  PVar2 = (pVVar13->type).physical_type_;
  local_e8 = size;
  switch(PVar2) {
  case BOOL:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              pdVar3[uVar23 + uVar24] = local_e0.data[iVar20];
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            pdVar3[uVar17] = local_e0.data[uVar23];
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case UINT8:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        uVar24 = 0;
        do {
          uVar16 = uVar19;
          if (*(long *)local_98._0_8_ != 0) {
            uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
          }
          uVar23 = uVar19;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
          }
          uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
          uVar16 = local_e8 - uVar24;
          if (uVar17 < local_e8 - uVar24) {
            uVar16 = uVar17;
          }
          if (uVar16 != 0) {
            uVar17 = 0;
            do {
              pdVar3[uVar17 + uVar24] = local_e0.data[uVar23];
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = local_e8 - uVar24;
        if (uVar17 < local_e8 - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            pdVar3[uVar17] = local_e0.data[uVar23];
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
          }
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
    }
    break;
  case INT8:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        uVar24 = 0;
        do {
          uVar16 = uVar19;
          if (*(long *)local_98._0_8_ != 0) {
            uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
          }
          uVar23 = uVar19;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
          }
          uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar17 < size - uVar24) {
            uVar16 = uVar17;
          }
          if (uVar16 != 0) {
            uVar17 = 0;
            do {
              pdVar3[uVar17 + uVar24] = local_e0.data[uVar23];
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            pdVar3[uVar17] = local_e0.data[uVar23];
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
          }
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case UINT16:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined2 *)(pdVar3 + uVar23 * 2 + uVar24 * 2) =
                   *(undefined2 *)(local_e0.data + iVar20 * 2);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined2 *)(pdVar3 + uVar17 * 2) = *(undefined2 *)(local_e0.data + uVar23 * 2);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case INT16:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined2 *)(pdVar3 + uVar23 * 2 + uVar24 * 2) =
                   *(undefined2 *)(local_e0.data + iVar20 * 2);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined2 *)(pdVar3 + uVar17 * 2) = *(undefined2 *)(local_e0.data + uVar23 * 2);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case UINT32:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined4 *)(pdVar3 + uVar23 * 4 + uVar24 * 4) =
                   *(undefined4 *)(local_e0.data + iVar20 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined4 *)(pdVar3 + uVar17 * 4) = *(undefined4 *)(local_e0.data + uVar23 * 4);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case INT32:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined4 *)(pdVar3 + uVar23 * 4 + uVar24 * 4) =
                   *(undefined4 *)(local_e0.data + iVar20 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined4 *)(pdVar3 + uVar17 * 4) = *(undefined4 *)(local_e0.data + uVar23 * 4);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case UINT64:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined8 *)(pdVar3 + uVar23 * 8 + uVar24 * 8) =
                   *(undefined8 *)(local_e0.data + iVar20 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined8 *)(pdVar3 + uVar17 * 8) = *(undefined8 *)(local_e0.data + uVar23 * 8);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case INT64:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined8 *)(pdVar3 + uVar23 * 8 + uVar24 * 8) =
                   *(undefined8 *)(local_e0.data + iVar20 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined8 *)(pdVar3 + uVar17 * 8) = *(undefined8 *)(local_e0.data + uVar23 * 8);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_01565cd1_caseD_a:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98._0_8_ = local_98 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"RunEndEncoded value type \'%s\' not supported yet","");
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)PVar2,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)local_98,&local_50);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined4 *)(pdVar3 + uVar23 * 4 + uVar24 * 4) =
                   *(undefined4 *)(local_e0.data + iVar20 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined4 *)(pdVar3 + uVar17 * 4) = *(undefined4 *)(local_e0.data + uVar23 * 4);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case DOUBLE:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        lVar5 = *(long *)local_98._0_8_;
        psVar6 = (local_e0.sel)->sel_vector;
        uVar24 = 0;
        do {
          iVar22 = uVar19;
          if (lVar5 != 0) {
            iVar22 = (idx_t)*(uint *)(lVar5 + uVar19 * 4);
          }
          iVar20 = uVar19;
          if (psVar6 != (sel_t *)0x0) {
            iVar20 = (idx_t)psVar6[uVar19];
          }
          uVar23 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + iVar22 * 4) - uVar24) - scan_offset;
          uVar16 = size - uVar24;
          if (uVar23 < size - uVar24) {
            uVar16 = uVar23;
          }
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined8 *)(pdVar3 + uVar23 * 8 + uVar24 * 8) =
                   *(undefined8 *)(local_e0.data + iVar20 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < size) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      local_f8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar24 = 0;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = size - uVar24;
        if (uVar17 < size - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar24;
        uVar21 = uVar16;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar21 != 0; uVar21 = uVar21 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_f8);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar17 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar17 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar17 = uVar17 + 1;
          }
        }
        else if (uVar16 != 0) {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          do {
            *(undefined8 *)(pdVar3 + uVar17 * 8) = *(undefined8 *)(local_e0.data + uVar23 * 8);
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) &&
              (uVar19 = uVar19 + 1, size = local_e8, uVar19 != compressed_size));
    }
    break;
  case INTERVAL:
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&run_end_encoding->run_ends);
    pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
    Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (compressed_size == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar24 = compressed_size;
      do {
        uVar16 = uVar24 + uVar19 >> 1;
        if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + uVar16 * 4) <= scan_offset) {
          uVar19 = uVar16 + 1;
          uVar16 = uVar24;
        }
        uVar24 = uVar16;
      } while (uVar19 < uVar24);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar19 < compressed_size) {
        uVar24 = 0;
        do {
          uVar16 = uVar19;
          if (*(long *)local_98._0_8_ != 0) {
            uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
          }
          uVar23 = uVar19;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
          }
          uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
          uVar16 = local_e8 - uVar24;
          if (uVar17 < local_e8 - uVar24) {
            uVar16 = uVar17;
          }
          if (uVar16 != 0) {
            pdVar18 = pdVar3 + uVar24 * 0x10;
            uVar17 = uVar16;
            do {
              uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
              *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
              *(undefined8 *)(pdVar18 + 8) = uVar11;
              pdVar18 = pdVar18 + 0x10;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else if (uVar19 < compressed_size) {
      uVar24 = 0;
      local_f8 = (buffer_ptr<ValidityBuffer> *)local_98._8_8_;
      do {
        uVar16 = uVar19;
        if (*(long *)local_98._0_8_ != 0) {
          uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
        }
        uVar23 = uVar19;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
        }
        uVar17 = ((long)*(int *)((long)&(local_f8->internal).
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
        uVar16 = local_e8 - uVar24;
        if (uVar17 < local_e8 - uVar24) {
          uVar16 = uVar17;
        }
        uVar17 = uVar16;
        uVar21 = uVar24;
        if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 >> 6]
             >> (uVar23 & 0x3f) & 1) == 0) {
          for (; uVar17 != 0; uVar17 = uVar17 - 1) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_f0);
              p_Var9 = p_Stack_100;
              peVar12 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
              }
              if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar21 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar21 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
            uVar21 = uVar21 + 1;
          }
        }
        else if (uVar16 != 0) {
          pdVar18 = pdVar3 + uVar24 * 0x10;
          uVar17 = uVar24;
          uVar21 = uVar16;
          do {
            uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
            *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
            *(undefined8 *)(pdVar18 + 8) = uVar11;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar7 != (unsigned_long *)0x0) {
              puVar1 = puVar7 + (uVar17 >> 6);
              *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
            }
            uVar17 = uVar17 + 1;
            pdVar18 = pdVar18 + 0x10;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar24 = uVar24 + uVar16;
      } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
    }
    break;
  default:
    if (PVar2 == VARCHAR) {
      peVar4 = (pVVar13->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var8 = (pVVar13->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      (result->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      p_Var9 = (result->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (result->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var8;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (&run_end_encoding->run_ends);
      pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
      Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
      pdVar3 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (compressed_size == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        uVar24 = compressed_size;
        do {
          uVar16 = uVar24 + uVar19 >> 1;
          if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + uVar16 * 4) <= scan_offset) {
            uVar19 = uVar16 + 1;
            uVar16 = uVar24;
          }
          uVar24 = uVar16;
        } while (uVar19 < uVar24);
      }
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar19 < compressed_size) {
          uVar24 = 0;
          do {
            uVar16 = uVar19;
            if (*(long *)local_98._0_8_ != 0) {
              uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
            }
            uVar23 = uVar19;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
            }
            uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
            uVar16 = local_e8 - uVar24;
            if (uVar17 < local_e8 - uVar24) {
              uVar16 = uVar17;
            }
            if (uVar16 != 0) {
              pdVar18 = pdVar3 + uVar24 * 0x10;
              uVar17 = uVar16;
              do {
                uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
                *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
                *(undefined8 *)(pdVar18 + 8) = uVar11;
                pdVar18 = pdVar18 + 0x10;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            uVar24 = uVar24 + uVar16;
          } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
        }
      }
      else if (uVar19 < compressed_size) {
        uVar24 = 0;
        local_f8 = (buffer_ptr<ValidityBuffer> *)local_98._8_8_;
        do {
          uVar16 = uVar19;
          if (*(long *)local_98._0_8_ != 0) {
            uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
          }
          uVar23 = uVar19;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
          }
          uVar17 = ((long)*(int *)((long)&(local_f8->internal).
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
          uVar16 = local_e8 - uVar24;
          if (uVar17 < local_e8 - uVar24) {
            uVar16 = uVar17;
          }
          uVar17 = uVar16;
          uVar21 = uVar24;
          if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
            for (; uVar17 != 0; uVar17 = uVar17 - 1) {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_108,&local_f0);
                p_Var9 = p_Stack_100;
                peVar12 = local_108;
                local_108 = (element_type *)0x0;
                p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar12;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var9;
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                }
                if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
                }
                pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar15->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar10 = (byte)uVar21 & 0x3f;
              puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              uVar21 = uVar21 + 1;
            }
          }
          else if (uVar16 != 0) {
            pdVar18 = pdVar3 + uVar24 * 0x10;
            uVar17 = uVar24;
            uVar21 = uVar16;
            do {
              uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
              *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
              *(undefined8 *)(pdVar18 + 8) = uVar11;
              puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar7 != (unsigned_long *)0x0) {
                puVar1 = puVar7 + (uVar17 >> 6);
                *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
              }
              uVar17 = uVar17 + 1;
              pdVar18 = pdVar18 + 0x10;
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
    else {
      if (PVar2 != INT128) goto switchD_01565cd1_caseD_a;
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (&run_end_encoding->run_ends);
      pVVar14 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
      Vector::ToUnifiedFormat(pVVar13,compressed_size,(UnifiedVectorFormat *)local_98);
      Vector::ToUnifiedFormat(pVVar14,compressed_size,&local_e0);
      pdVar3 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (compressed_size == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        uVar24 = compressed_size;
        do {
          uVar16 = uVar24 + uVar19 >> 1;
          if ((ulong)(long)*(int *)((long)&(((original *)local_98._8_8_)->
                                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + uVar16 * 4) <= scan_offset) {
            uVar19 = uVar16 + 1;
            uVar16 = uVar24;
          }
          uVar24 = uVar16;
        } while (uVar19 < uVar24);
      }
      if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar19 < compressed_size) {
          uVar24 = 0;
          do {
            uVar16 = uVar19;
            if (*(long *)local_98._0_8_ != 0) {
              uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
            }
            uVar23 = uVar19;
            if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
              uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
            }
            uVar17 = ((long)*(int *)((long)&(((original *)local_98._8_8_)->
                                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
            uVar16 = local_e8 - uVar24;
            if (uVar17 < local_e8 - uVar24) {
              uVar16 = uVar17;
            }
            if (uVar16 != 0) {
              pdVar18 = pdVar3 + uVar24 * 0x10;
              uVar17 = uVar16;
              do {
                uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
                *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
                *(undefined8 *)(pdVar18 + 8) = uVar11;
                pdVar18 = pdVar18 + 0x10;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            uVar24 = uVar24 + uVar16;
          } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
        }
      }
      else if (uVar19 < compressed_size) {
        uVar24 = 0;
        local_f8 = (buffer_ptr<ValidityBuffer> *)local_98._8_8_;
        do {
          uVar16 = uVar19;
          if (*(long *)local_98._0_8_ != 0) {
            uVar16 = (ulong)*(uint *)(*(long *)local_98._0_8_ + uVar19 * 4);
          }
          uVar23 = uVar19;
          if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
            uVar23 = (ulong)(local_e0.sel)->sel_vector[uVar19];
          }
          uVar17 = ((long)*(int *)((long)&(local_f8->internal).
                                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + uVar16 * 4) - uVar24) - scan_offset;
          uVar16 = local_e8 - uVar24;
          if (uVar17 < local_e8 - uVar24) {
            uVar16 = uVar17;
          }
          uVar17 = uVar16;
          uVar21 = uVar24;
          if ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
            for (; uVar17 != 0; uVar17 = uVar17 - 1) {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_f0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_108,&local_f0);
                p_Var9 = p_Stack_100;
                peVar12 = local_108;
                local_108 = (element_type *)0x0;
                p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar12;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var9;
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                }
                if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
                }
                pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar15->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar10 = (byte)uVar21 & 0x3f;
              puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              uVar21 = uVar21 + 1;
            }
          }
          else if (uVar16 != 0) {
            pdVar18 = pdVar3 + uVar24 * 0x10;
            uVar17 = uVar24;
            uVar21 = uVar16;
            do {
              uVar11 = *(undefined8 *)(local_e0.data + uVar23 * 0x10 + 8);
              *(undefined8 *)pdVar18 = *(undefined8 *)(local_e0.data + uVar23 * 0x10);
              *(undefined8 *)(pdVar18 + 8) = uVar11;
              puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar7 != (unsigned_long *)0x0) {
                puVar1 = puVar7 + (uVar17 >> 6);
                *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
              }
              uVar17 = uVar17 + 1;
              pdVar18 = pdVar18 + 0x10;
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
          }
          uVar24 = uVar24 + uVar16;
        } while ((uVar24 < local_e8) && (uVar19 = uVar19 + 1, uVar19 != compressed_size));
      }
    }
  }
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return;
}

Assistant:

static void FlattenRunEndsSwitch(Vector &result, ArrowRunEndEncodingState &run_end_encoding, idx_t compressed_size,
                                 idx_t scan_offset, idx_t size) {
	auto &values = *run_end_encoding.values;
	auto physical_type = values.GetType().InternalType();

	switch (physical_type) {
	case PhysicalType::INT8:
		FlattenRunEnds<RUN_END_TYPE, int8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT16:
		FlattenRunEnds<RUN_END_TYPE, int16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEnds<RUN_END_TYPE, int32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEnds<RUN_END_TYPE, int64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT128:
		FlattenRunEnds<RUN_END_TYPE, hugeint_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT8:
		FlattenRunEnds<RUN_END_TYPE, uint8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT16:
		FlattenRunEnds<RUN_END_TYPE, uint16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT32:
		FlattenRunEnds<RUN_END_TYPE, uint32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT64:
		FlattenRunEnds<RUN_END_TYPE, uint64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::BOOL:
		FlattenRunEnds<RUN_END_TYPE, bool>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::FLOAT:
		FlattenRunEnds<RUN_END_TYPE, float>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::DOUBLE:
		FlattenRunEnds<RUN_END_TYPE, double>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INTERVAL:
		FlattenRunEnds<RUN_END_TYPE, interval_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::VARCHAR: {
		// Share the string heap, we don't need to allocate new strings, we just reference the existing ones
		result.SetAuxiliary(values.GetAuxiliary());
		FlattenRunEnds<RUN_END_TYPE, string_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	}
	default:
		throw NotImplementedException("RunEndEncoded value type '%s' not supported yet", TypeIdToString(physical_type));
	}
}